

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

void __thiscall tl::StrT<char>::eraseRange(StrT<char> *this,u32 from,u32 to)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint local_24;
  u32 i;
  u32 nToDel;
  u32 prevSize;
  u32 to_local;
  u32 from_local;
  StrT<char> *this_local;
  
  uVar1 = this->_size;
  bVar2 = false;
  if (from <= to) {
    bVar2 = to <= this->_size;
  }
  if (!bVar2) {
    __assert_fail("from <= to && to <= _size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/str.cpp"
                  ,299,"void tl::StrT<char>::eraseRange(u32, u32) [CharT = char]");
  }
  iVar3 = to - from;
  for (local_24 = from; local_24 + iVar3 < uVar1; local_24 = local_24 + 1) {
    this->_str[local_24] = this->_str[local_24 + iVar3];
  }
  resize(this,uVar1 - iVar3);
  return;
}

Assistant:

void StrT<CharT>::eraseRange(u32 from, u32 to)
{
    const u32 prevSize = _size;
    assert(from <= to && to <= _size);

    const u32 nToDel = to - from;
    for(u32 i = from; i + nToDel < prevSize; i++) {
        _str[i] = _str[i + nToDel];
    }
    resize(prevSize - nToDel);
}